

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric_input.cpp
# Opt level: O2

Reals __thiscall
Omega_h::get_variation_metrics(Omega_h *this,Mesh *mesh,Real knob,Int dim,Int ncomps,Reals *data)

{
  Alloc *pAVar1;
  LO LVar2;
  Int IVar3;
  int iVar4;
  void *extraout_RDX;
  void *pvVar5;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  ulong uVar6;
  char *pcVar7;
  Write<double> *this_00;
  int comp;
  Reals RVar8;
  undefined8 uStack_130;
  Reals vert_grads;
  Reals vert_data;
  Write<double> local_d0;
  Write<double> local_c0;
  Write<double> local_b0;
  Write<double> local_a0;
  Write<double> local_90;
  Omega_h local_80 [16];
  Write<double> local_70;
  Write<double> local_60;
  Write<double> local_50;
  Write<double> local_40;
  
  pAVar1 = (data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar6 = pAVar1->size;
  }
  else {
    uVar6 = (ulong)pAVar1 >> 3;
  }
  LVar2 = Mesh::nents(mesh,dim);
  if (LVar2 * ncomps == (int)(uVar6 >> 3)) {
    if (ncomps == 1) {
      if (dim == 0) {
        Write<double>::Write(&local_40,&data->write_);
        recover_hessians((Omega_h *)&vert_data,mesh,(Reals *)&local_40);
        Write<double>::~Write(&local_40);
        IVar3 = Mesh::dim(mesh);
        Write<double>::Write(&local_a0,&vert_data.write_);
        get_hessian_metrics(this,IVar3,(Reals *)&local_a0,knob);
        this_00 = &local_a0;
      }
      else {
        IVar3 = Mesh::dim(mesh);
        if (IVar3 != dim) {
          pcVar7 = "false";
          uStack_130 = 0x42;
          goto LAB_002facac;
        }
        Write<double>::Write(&local_50,&data->write_);
        project_by_fit((Omega_h *)&vert_data,mesh,(Reals *)&local_50);
        Write<double>::~Write(&local_50);
        Write<double>::Write(&local_b0,&vert_data.write_);
        recover_gradients((Omega_h *)&vert_grads,mesh,(Reals *)&local_b0);
        Write<double>::~Write(&local_b0);
        IVar3 = Mesh::dim(mesh);
        Write<double>::Write(&local_c0,&vert_grads.write_);
        get_gradient_metrics(this,IVar3,(Reals *)&local_c0,knob);
        Write<double>::~Write(&local_c0);
        this_00 = &vert_grads.write_;
      }
      Write<double>::~Write(this_00);
      Write<double>::~Write(&vert_data.write_);
      pvVar5 = extraout_RDX_01;
    }
    else {
      comp = 0;
      iVar4 = 0;
      if (0 < ncomps) {
        iVar4 = ncomps;
      }
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      pvVar5 = extraout_RDX;
      for (; iVar4 != comp; comp = comp + 1) {
        Write<double>::Write(&local_60,&data->write_);
        get_component<double>((Omega_h *)&vert_data,(Read<double> *)&local_60,ncomps,comp);
        Write<double>::~Write(&local_60);
        Write<double>::Write(&local_70,(Write<double> *)&vert_data);
        get_variation_metrics((Omega_h *)&vert_grads,mesh,knob,dim,1,(Reals *)&local_70);
        Write<double>::~Write(&local_70);
        if (comp == 0) {
          Write<double>::operator=((Write<double> *)this,&vert_grads.write_);
        }
        else {
          LVar2 = Mesh::nverts(mesh);
          Write<double>::Write(&local_d0,(Write<double> *)this);
          Write<double>::Write(&local_90,&vert_grads.write_);
          intersect_metrics(local_80,LVar2,(Reals *)&local_d0,(Reals *)&local_90);
          Write<double>::operator=((Write<double> *)this,(Write<signed_char> *)local_80);
          Write<double>::~Write((Write<double> *)local_80);
          Write<double>::~Write(&local_90);
          Write<double>::~Write(&local_d0);
        }
        Write<double>::~Write(&vert_grads.write_);
        Write<double>::~Write(&vert_data.write_);
        pvVar5 = extraout_RDX_00;
      }
    }
    RVar8.write_.shared_alloc_.direct_ptr = pvVar5;
    RVar8.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar8.write_.shared_alloc_;
  }
  pcVar7 = "data.size() == mesh->nents(dim) * ncomps";
  uStack_130 = 0x2b;
LAB_002facac:
  fail("assertion %s failed at %s +%d\n",pcVar7,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric_input.cpp"
       ,uStack_130);
}

Assistant:

static Reals get_variation_metrics(
    Mesh* mesh, Real knob, Int dim, Int ncomps, Reals data) {
  OMEGA_H_CHECK(data.size() == mesh->nents(dim) * ncomps);
  if (ncomps == 1) {
    if (dim == VERT) {
      auto hessians = recover_hessians(mesh, data);
      return get_hessian_metrics(mesh->dim(), hessians, knob);
    } else if (dim == mesh->dim()) {
      auto vert_data = project_by_fit(mesh, data);
      auto vert_grads = recover_gradients(mesh, vert_data);
      return get_gradient_metrics(mesh->dim(), vert_grads, knob);
    }
  } else {
    Reals metrics;
    for (Int comp = 0; comp < ncomps; ++comp) {
      auto comp_data = get_component(data, ncomps, comp);
      auto comp_metrics = get_variation_metrics(mesh, knob, dim, 1, comp_data);
      if (comp) {
        metrics = intersect_metrics(mesh->nverts(), metrics, comp_metrics);
      } else {
        metrics = comp_metrics;
      }
    }
    return metrics;
  }
  OMEGA_H_NORETURN(Reals());
}